

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceneRender.cpp
# Opt level: O1

void __thiscall SceneRender::renderBackground(SceneRender *this,Uniforms *_uniforms)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TextureCube *pTVar2;
  int iVar3;
  Vbo *pVVar4;
  Vbo *this_00;
  undefined8 *puVar5;
  undefined4 extraout_var_00;
  long lVar6;
  _Alloc_hider _Var7;
  Shader *pSVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  mat<4,_4,_float,_(glm::qualifier)0> Result;
  mat4 ori;
  mat4 local_1b0;
  string local_170;
  undefined1 local_150 [4];
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aStack_14c;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 aStack_148;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 aStack_144;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_140;
  undefined8 uStack_130;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 local_128;
  undefined8 local_124;
  undefined8 uStack_11c;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 local_114;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  undefined4 extraout_var;
  
  if (this->m_background == true) {
    if ((_uniforms->tracker).m_running == true) {
      _local_150 = (pointer)&aStack_140;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_150,"render:scene:background","");
      Tracker::begin(&_uniforms->tracker,(string *)local_150);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_local_150 != &aStack_140) {
        operator_delete(_local_150,
                        CONCAT44(aStack_140._M_allocated_capacity._4_4_,
                                 aStack_140._M_allocated_capacity._0_4_) + 1);
      }
    }
    glDisable(0xb71);
    pSVar8 = &this->m_background_shader;
    vera::Shader::use(pSVar8);
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_1b0.value + 1);
    local_1b0.value[0]._0_8_ = paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"u_modelMatrix","");
    local_150 = (undefined1  [4])0x3f800000;
    aStack_14c.y = 0.0;
    aStack_148.z = 0.0;
    aStack_144.w = 0.0;
    aStack_140._M_allocated_capacity._0_4_ = 0;
    aStack_140._M_allocated_capacity._4_4_ = 0x3f800000;
    aStack_140._8_8_ = 0;
    uStack_130 = (pointer)0x0;
    local_128.z = 1.0;
    local_124 = 0;
    uStack_11c._0_4_ = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
    uStack_11c._4_4_ = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
    local_114.w = 1.0;
    vera::Shader::setUniform(pSVar8,(string *)&local_1b0,(mat4 *)local_150,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0.value[0]._0_8_ != paVar1) {
      operator_delete((void *)local_1b0.value[0]._0_8_,
                      CONCAT44(local_1b0.value[1].field_1,local_1b0.value[1].field_0) + 1);
    }
    local_1b0.value[0]._0_8_ = paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"u_viewMatrix","");
    local_150 = (undefined1  [4])0x3f800000;
    aStack_14c.y = 0.0;
    aStack_148.z = 0.0;
    aStack_144.w = 0.0;
    aStack_140._M_allocated_capacity._0_4_ = 0;
    aStack_140._M_allocated_capacity._4_4_ = 0x3f800000;
    aStack_140._8_8_ = 0;
    uStack_130 = (pointer)0x0;
    local_128.z = 1.0;
    local_124 = 0;
    uStack_11c._0_4_ = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
    uStack_11c._4_4_ = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
    local_114.w = 1.0;
    vera::Shader::setUniform(pSVar8,(string *)&local_1b0,(mat4 *)local_150,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0.value[0]._0_8_ != paVar1) {
      operator_delete((void *)local_1b0.value[0]._0_8_,
                      CONCAT44(local_1b0.value[1].field_1,local_1b0.value[1].field_0) + 1);
    }
    local_1b0.value[0]._0_8_ = paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"u_projectionMatrix","");
    local_150 = (undefined1  [4])0x3f800000;
    aStack_14c.y = 0.0;
    aStack_148.z = 0.0;
    aStack_144.w = 0.0;
    aStack_140._M_allocated_capacity._0_4_ = 0;
    aStack_140._M_allocated_capacity._4_4_ = 0x3f800000;
    aStack_140._8_8_ = 0;
    uStack_130 = (pointer)0x0;
    local_128.z = 1.0;
    local_124 = 0;
    uStack_11c._0_4_ = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
    uStack_11c._4_4_ = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
    local_114.w = 1.0;
    vera::Shader::setUniform(pSVar8,(string *)&local_1b0,(mat4 *)local_150,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0.value[0]._0_8_ != paVar1) {
      operator_delete((void *)local_1b0.value[0]._0_8_,
                      CONCAT44(local_1b0.value[1].field_1,local_1b0.value[1].field_0) + 1);
    }
    local_1b0.value[0]._0_8_ = paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1b0,"u_modelViewProjectionMatrix","");
    local_150 = (undefined1  [4])0x3f800000;
    aStack_14c.y = 0.0;
    aStack_148.z = 0.0;
    aStack_144.w = 0.0;
    aStack_140._M_allocated_capacity._0_4_ = 0.0;
    aStack_140._M_allocated_capacity._4_4_ = 1.0;
    aStack_140._8_8_ = 0;
    uStack_130 = (pointer)0x0;
    local_128.z = 1.0;
    local_124 = 0;
    uStack_11c._0_4_ = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
    uStack_11c._4_4_ = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
    local_114.w = 1.0;
    vera::Shader::setUniform(pSVar8,(string *)&local_1b0,(mat4 *)local_150,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0.value[0]._0_8_ != paVar1) {
      operator_delete((void *)local_1b0.value[0]._0_8_,
                      CONCAT44(local_1b0.value[1].field_1,local_1b0.value[1].field_0) + 1);
    }
    (*(_uniforms->super_Scene)._vptr_Scene[0x3e])(_uniforms,pSVar8,1,1);
    pVVar4 = vera::getBillboard();
    vera::Vbo::render(pVVar4,pSVar8);
    if ((_uniforms->tracker).m_running != true) {
      return;
    }
    _local_150 = (pointer)&aStack_140;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_150,"render:scene:background","");
    Tracker::end(&_uniforms->tracker,(string *)local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_local_150 == &aStack_140) {
      return;
    }
    lVar6 = CONCAT44(aStack_140._M_allocated_capacity._4_4_,aStack_140._M_allocated_capacity._0_4_);
    _Var7._M_p = _local_150;
  }
  else {
    pTVar2 = (_uniforms->super_Scene).activeCubemap;
    if (pTVar2 == (TextureCube *)0x0) {
      return;
    }
    if (this->showCubebox != true) {
      return;
    }
    iVar3 = (*(pTVar2->super_Texture)._vptr_Texture[9])();
    if ((char)iVar3 == '\0') {
      return;
    }
    if ((_uniforms->tracker).m_running == true) {
      _local_150 = (pointer)&aStack_140;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"render:scene:cubemap","")
      ;
      Tracker::begin(&_uniforms->tracker,(string *)local_150);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_local_150 != &aStack_140) {
        operator_delete(_local_150,
                        CONCAT44(aStack_140._M_allocated_capacity._4_4_,
                                 aStack_140._M_allocated_capacity._0_4_) + 1);
      }
    }
    glDisable(0xb71);
    if ((this->m_cubemap_vbo)._M_t.super___uniq_ptr_impl<vera::Vbo,_std::default_delete<vera::Vbo>_>
        ._M_t.super__Tuple_impl<0UL,_vera::Vbo_*,_std::default_delete<vera::Vbo>_>.
        super__Head_base<0UL,_vera::Vbo_*,_false>._M_head_impl == (Vbo *)0x0) {
      this_00 = (Vbo *)operator_new(0x60);
      vera::cubeMesh((Mesh *)local_150,1.0);
      vera::Vbo::Vbo(this_00,(Mesh *)local_150);
      pVVar4 = (this->m_cubemap_vbo)._M_t.
               super___uniq_ptr_impl<vera::Vbo,_std::default_delete<vera::Vbo>_>._M_t.
               super__Tuple_impl<0UL,_vera::Vbo_*,_std::default_delete<vera::Vbo>_>.
               super__Head_base<0UL,_vera::Vbo_*,_false>._M_head_impl;
      (this->m_cubemap_vbo)._M_t.super___uniq_ptr_impl<vera::Vbo,_std::default_delete<vera::Vbo>_>.
      _M_t.super__Tuple_impl<0UL,_vera::Vbo_*,_std::default_delete<vera::Vbo>_>.
      super__Head_base<0UL,_vera::Vbo_*,_false>._M_head_impl = this_00;
      if (pVVar4 != (Vbo *)0x0) {
        (*pVVar4->_vptr_Vbo[1])();
      }
      vera::Mesh::~Mesh((Mesh *)local_150);
    }
    (*(((_uniforms->super_Scene).activeCamera)->super_Node)._vptr_Node[0x1c])(local_150);
    pSVar8 = &this->m_cubemap_shader;
    vera::Shader::use(pSVar8);
    paVar1 = &local_170.field_2;
    local_170._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_170,"u_modelViewProjectionMatrix","");
    iVar3 = (*(((_uniforms->super_Scene).activeCamera)->super_Node)._vptr_Node[0x59])();
    puVar5 = (undefined8 *)CONCAT44(extraout_var,iVar3);
    local_68 = *puVar5;
    fVar11 = (float)local_68;
    local_48 = (float)((ulong)local_68 >> 0x20);
    uStack_60 = 0;
    local_58 = puVar5[1];
    fVar14 = (float)local_58;
    local_38 = (float)((ulong)local_58 >> 0x20);
    local_78 = puVar5[2];
    fVar17 = (float)local_78;
    fVar18 = (float)((ulong)local_78 >> 0x20);
    uStack_70 = 0;
    local_88 = puVar5[3];
    fVar15 = (float)local_88;
    fVar16 = (float)((ulong)local_88 >> 0x20);
    local_98 = puVar5[4];
    fVar12 = (float)local_98;
    fVar13 = (float)((ulong)local_98 >> 0x20);
    uStack_50 = 0;
    uStack_80 = 0;
    uStack_90 = 0;
    local_a8 = puVar5[5];
    fVar9 = (float)local_a8;
    fVar10 = (float)((ulong)local_a8 >> 0x20);
    uStack_a0 = 0;
    fVar19 = (float)puVar5[6];
    fVar20 = (float)((ulong)puVar5[6] >> 0x20);
    local_1b0.value[0].field_0.x =
         fVar19 * aStack_144.w +
         fVar12 * aStack_148.z + fVar17 * aStack_14c.y + fVar11 * (float)local_150;
    local_1b0.value[0].field_1.y =
         fVar20 * aStack_144.w +
         fVar13 * aStack_148.z + fVar18 * aStack_14c.y + local_48 * (float)local_150;
    fVar21 = (float)puVar5[7];
    local_1b0.value[0].field_2.z =
         fVar21 * aStack_144.w +
         fVar9 * aStack_148.z + fVar15 * aStack_14c.y + fVar14 * (float)local_150;
    fVar22 = (float)((ulong)puVar5[7] >> 0x20);
    local_1b0.value[0].field_3.w =
         aStack_144.w * fVar22 +
         aStack_148.z * fVar10 + aStack_14c.y * fVar16 + (float)local_150 * local_38;
    local_1b0.value[1].field_0.x =
         fVar19 * (float)aStack_140._12_4_ +
         fVar12 * (float)aStack_140._8_4_ +
         fVar17 * (float)aStack_140._M_allocated_capacity._4_4_ +
         fVar11 * (float)aStack_140._M_allocated_capacity._0_4_;
    local_1b0.value[1].field_1.y =
         fVar20 * (float)aStack_140._12_4_ +
         fVar13 * (float)aStack_140._8_4_ +
         fVar18 * (float)aStack_140._M_allocated_capacity._4_4_ +
         local_48 * (float)aStack_140._M_allocated_capacity._0_4_;
    local_1b0.value[1].field_3.w =
         (float)aStack_140._12_4_ * fVar22 +
         (float)aStack_140._8_4_ * fVar10 +
         (float)aStack_140._M_allocated_capacity._4_4_ * fVar16 +
         (float)aStack_140._M_allocated_capacity._0_4_ * local_38;
    local_1b0.value[1].field_2.z =
         fVar21 * (float)aStack_140._12_4_ +
         fVar9 * (float)aStack_140._8_4_ +
         fVar15 * (float)aStack_140._M_allocated_capacity._4_4_ +
         fVar14 * (float)aStack_140._M_allocated_capacity._0_4_;
    local_1b0.value[2].field_2.z =
         fVar21 * local_124._0_4_ +
         fVar9 * local_128.z + fVar15 * uStack_130._4_4_ + fVar14 * uStack_130._0_4_;
    local_1b0.value[2].field_1.y =
         fVar20 * local_124._0_4_ +
         fVar13 * local_128.z + fVar18 * uStack_130._4_4_ + local_48 * uStack_130._0_4_;
    local_1b0.value[2].field_0.x =
         fVar19 * local_124._0_4_ +
         fVar12 * local_128.z + fVar17 * uStack_130._4_4_ + fVar11 * uStack_130._0_4_;
    local_1b0.value[3].field_3.w =
         fVar22 * local_114.w +
         fVar10 * uStack_11c._4_4_ + fVar16 * uStack_11c._0_4_ + local_38 * local_124._4_4_;
    local_1b0.value[3].field_0.x =
         fVar19 * local_114.w +
         fVar12 * uStack_11c._4_4_ + fVar17 * uStack_11c._0_4_ + fVar11 * local_124._4_4_;
    local_1b0.value[2].field_3.w =
         local_124._0_4_ * fVar22 +
         local_128.z * fVar10 + uStack_130._4_4_ * fVar16 + uStack_130._0_4_ * local_38;
    local_1b0.value[3].field_2.z =
         fVar21 * local_114.w +
         fVar9 * uStack_11c._4_4_ + fVar15 * uStack_11c._0_4_ + fVar14 * local_124._4_4_;
    local_1b0.value[3].field_1.y =
         fVar20 * local_114.w +
         fVar13 * uStack_11c._4_4_ + fVar18 * uStack_11c._0_4_ + local_48 * local_124._4_4_;
    fStack_44 = local_48;
    fStack_40 = local_48;
    fStack_3c = local_48;
    fStack_34 = local_38;
    fStack_30 = local_38;
    fStack_2c = local_38;
    vera::Shader::setUniform(pSVar8,&local_170,&local_1b0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != paVar1) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
    local_170._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"u_modelMatrix","");
    local_1b0.value[0].field_0.x = 1.0;
    local_1b0.value[0].field_1.y = 0.0;
    local_1b0.value[0].field_2.z = 0.0;
    local_1b0.value[0].field_3.w = 0.0;
    local_1b0.value[1].field_0.x = 0.0;
    local_1b0.value[1].field_1.y = 1.0;
    local_1b0.value[1].field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0
    ;
    local_1b0.value[1].field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0
    ;
    local_1b0.value[2].field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0
    ;
    local_1b0.value[2].field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0
    ;
    local_1b0.value[2].field_2.z = 1.0;
    local_1b0.value[2].field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0
    ;
    local_1b0.value[3].field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0
    ;
    local_1b0.value[3].field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0
    ;
    local_1b0.value[3].field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0
    ;
    local_1b0.value[3].field_3.w = 1.0;
    vera::Shader::setUniform(pSVar8,&local_170,&local_1b0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != paVar1) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_1b0.value + 1);
    local_1b0.value[0]._0_8_ = paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"u_viewMatrix","");
    vera::Shader::setUniform(pSVar8,(string *)&local_1b0,(mat4 *)local_150,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0.value[0]._0_8_ != paVar1) {
      operator_delete((void *)local_1b0.value[0]._0_8_,
                      CONCAT44(local_1b0.value[1].field_1,local_1b0.value[1].field_0) + 1);
    }
    local_1b0.value[0]._0_8_ = paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"u_projectionMatrix","");
    iVar3 = (*(((_uniforms->super_Scene).activeCamera)->super_Node)._vptr_Node[0x59])();
    vera::Shader::setUniform
              (pSVar8,(string *)&local_1b0,(mat4 *)CONCAT44(extraout_var_00,iVar3),false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0.value[0]._0_8_ != paVar1) {
      operator_delete((void *)local_1b0.value[0]._0_8_,
                      CONCAT44(local_1b0.value[1].field_1,local_1b0.value[1].field_0) + 1);
    }
    local_1b0.value[0]._0_8_ = paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"u_cubeMap","");
    vera::Shader::setUniformTextureCube
              (pSVar8,(string *)&local_1b0,(_uniforms->super_Scene).activeCubemap,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0.value[0]._0_8_ != paVar1) {
      operator_delete((void *)local_1b0.value[0]._0_8_,
                      CONCAT44(local_1b0.value[1].field_1,local_1b0.value[1].field_0) + 1);
    }
    vera::Vbo::render((this->m_cubemap_vbo)._M_t.
                      super___uniq_ptr_impl<vera::Vbo,_std::default_delete<vera::Vbo>_>._M_t.
                      super__Tuple_impl<0UL,_vera::Vbo_*,_std::default_delete<vera::Vbo>_>.
                      super__Head_base<0UL,_vera::Vbo_*,_false>._M_head_impl,pSVar8);
    if ((_uniforms->tracker).m_running != true) {
      return;
    }
    local_1b0.value[0]._0_8_ = paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"render:scene:cubemap","");
    Tracker::end(&_uniforms->tracker,(string *)&local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0.value[0]._0_8_ == paVar1) {
      return;
    }
    lVar6 = CONCAT44(local_1b0.value[1].field_1,local_1b0.value[1].field_0);
    _Var7._M_p = (pointer)local_1b0.value[0]._0_8_;
  }
  operator_delete(_Var7._M_p,lVar6 + 1);
  return;
}

Assistant:

void SceneRender::renderBackground(Uniforms& _uniforms) {
    if (m_background) {
        TRACK_BEGIN("render:scene:background")
        glDisable(GL_DEPTH_TEST);

        m_background_shader.use();
        m_background_shader.setUniform("u_modelMatrix", glm::mat4(1.0));
        m_background_shader.setUniform("u_viewMatrix", glm::mat4(1.0));
        m_background_shader.setUniform("u_projectionMatrix", glm::mat4(1.0));
        m_background_shader.setUniform("u_modelViewProjectionMatrix", glm::mat4(1.0));

        // Update Uniforms and textures
        _uniforms.feedTo( &m_background_shader );

        vera::getBillboard()->render( &m_background_shader );

        TRACK_END("render:scene:background")
    }

    else if (_uniforms.activeCubemap) {
        if (showCubebox && _uniforms.activeCubemap->loaded()) {
            TRACK_BEGIN("render:scene:cubemap")

            glDisable(GL_DEPTH_TEST);

            if (!m_cubemap_vbo)
                m_cubemap_vbo = std::unique_ptr<vera::Vbo>(new vera::Vbo( vera::cubeMesh(1.0f) ));

            glm::mat4 ori = _uniforms.activeCamera->getOrientationMatrix();

            #if defined(__EMSCRIPTEN__)
            if (vera::getXR() == vera::VR_MODE)
                ori = glm::inverse(ori);
            #endif

            m_cubemap_shader.use();
            m_cubemap_shader.setUniform("u_modelViewProjectionMatrix", _uniforms.activeCamera->getProjectionMatrix() * ori);
            m_cubemap_shader.setUniform("u_modelMatrix", glm::mat4(1.0));
            m_cubemap_shader.setUniform("u_viewMatrix", ori);
            m_cubemap_shader.setUniform("u_projectionMatrix", _uniforms.activeCamera->getProjectionMatrix());
            m_cubemap_shader.setUniformTextureCube("u_cubeMap", _uniforms.activeCubemap, 0);
            m_cubemap_vbo->render(&m_cubemap_shader);

            TRACK_END("render:scene:cubemap")
        }
    }
}